

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportBuildFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *param_3)

{
  long *plVar1;
  size_type sVar2;
  cmMakefile *this_00;
  bool bVar3;
  cmFileSet *pcVar4;
  pointer pbVar5;
  string *psVar6;
  ostream *poVar7;
  pointer puVar8;
  pointer puVar9;
  pointer pbVar10;
  long lVar11;
  ulong uVar12;
  string *psVar13;
  pointer config;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view str;
  string_view separator;
  string dest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  ostringstream e;
  string local_2d8;
  string local_2b8;
  string *local_288;
  cmGeneratorTarget *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  cmExportBuildFileGenerator *local_240;
  cmFileSet *local_238;
  string *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_210;
  string local_1f8;
  undefined8 local_1d8;
  char *local_1d0;
  char local_1c8 [32];
  undefined1 local_1a8 [16];
  size_type local_198;
  pointer local_190;
  undefined8 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  size_type local_178;
  pointer local_170;
  undefined8 local_168;
  char *local_160;
  ios_base local_138 [264];
  
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_280 = gte;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_258,gte->Makefile,IncludeEmptyConfig);
  local_288 = __return_storage_ptr__;
  local_240 = this;
  cmFileSet::CompileDirectoryEntries(&local_210,fileSet);
  local_230 = local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    config = local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_238 = fileSet;
    do {
      pcVar4 = local_238;
      psVar13 = config;
      cmFileSet::EvaluateDirectoryEntries
                (&local_228,local_238,&local_210,local_280->LocalGenerator,config,local_280,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      pbVar5 = local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = (long)local_210.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_210.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      puVar8 = local_210.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)uVar12 >> 5) {
        puVar8 = (pointer)((long)&((local_210.
                                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                  _M_head_impl + (uVar12 & 0xffffffffffffffe0));
        lVar11 = ((long)uVar12 >> 5) + 1;
        puVar9 = local_210.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
        do {
          if ((puVar9[-2]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar9 = puVar9 + -2;
            goto LAB_00451859;
          }
          if ((puVar9[-1]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar9 = puVar9 + -1;
            goto LAB_00451859;
          }
          if (((puVar9->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) goto LAB_00451859;
          if ((puVar9[1]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar9 = puVar9 + 1;
            goto LAB_00451859;
          }
          lVar11 = lVar11 + -1;
          puVar9 = puVar9 + 4;
        } while (1 < lVar11);
        uVar12 = (long)local_210.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
      }
      lVar11 = (long)uVar12 >> 3;
      if (lVar11 == 1) {
LAB_00451836:
        puVar9 = puVar8;
        if (((puVar8->_M_t).
             super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
             .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
            HadContextSensitiveCondition == false) {
          puVar9 = local_210.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
LAB_00451859:
        if (puVar9 == local_210.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0045189f;
        plVar1 = (long *)(pcVar4->Type)._M_dataplus._M_p;
        sVar2 = (pcVar4->Type)._M_string_length;
        bVar3 = true;
        if (sVar2 == 0x17) {
          auVar14[0] = -((char)*plVar1 == 'C');
          auVar14[1] = -(*(char *)((long)plVar1 + 1) == 'X');
          auVar14[2] = -(*(char *)((long)plVar1 + 2) == 'X');
          auVar14[3] = -(*(char *)((long)plVar1 + 3) == '_');
          auVar14[4] = -(*(char *)((long)plVar1 + 4) == 'M');
          auVar14[5] = -(*(char *)((long)plVar1 + 5) == 'O');
          auVar14[6] = -(*(char *)((long)plVar1 + 6) == 'D');
          auVar14[7] = -(*(char *)((long)plVar1 + 7) == 'U');
          auVar14[8] = -((char)plVar1[1] == 'L');
          auVar14[9] = -(*(char *)((long)plVar1 + 9) == 'E');
          auVar14[10] = -(*(char *)((long)plVar1 + 10) == '_');
          auVar14[0xb] = -(*(char *)((long)plVar1 + 0xb) == 'H');
          auVar14[0xc] = -(*(char *)((long)plVar1 + 0xc) == 'E');
          auVar14[0xd] = -(*(char *)((long)plVar1 + 0xd) == 'A');
          auVar14[0xe] = -(*(char *)((long)plVar1 + 0xe) == 'D');
          auVar14[0xf] = -(*(char *)((long)plVar1 + 0xf) == 'E');
          auVar15[0] = -(*(char *)((long)plVar1 + 7) == 'U');
          auVar15[1] = -((char)plVar1[1] == 'L');
          auVar15[2] = -(*(char *)((long)plVar1 + 9) == 'E');
          auVar15[3] = -(*(char *)((long)plVar1 + 10) == '_');
          auVar15[4] = -(*(char *)((long)plVar1 + 0xb) == 'H');
          auVar15[5] = -(*(char *)((long)plVar1 + 0xc) == 'E');
          auVar15[6] = -(*(char *)((long)plVar1 + 0xd) == 'A');
          auVar15[7] = -(*(char *)((long)plVar1 + 0xe) == 'D');
          auVar15[8] = -(*(char *)((long)plVar1 + 0xf) == 'E');
          auVar15[9] = -((char)plVar1[2] == 'R');
          auVar15[10] = -(*(char *)((long)plVar1 + 0x11) == '_');
          auVar15[0xb] = -(*(char *)((long)plVar1 + 0x12) == 'U');
          auVar15[0xc] = -(*(char *)((long)plVar1 + 0x13) == 'N');
          auVar15[0xd] = -(*(char *)((long)plVar1 + 0x14) == 'I');
          auVar15[0xe] = -(*(char *)((long)plVar1 + 0x15) == 'T');
          auVar15[0xf] = -(*(char *)((long)plVar1 + 0x16) == 'S');
          auVar15 = auVar15 & auVar14;
          if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00451b67;
        }
        else if ((sVar2 == 0xb) &&
                (*(long *)((long)plVar1 + 3) == 0x53454c55444f4d5f && *plVar1 == 0x55444f4d5f585843)
                ) {
LAB_00451b67:
          this_00 = local_240->LG->Makefile;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The \"",5);
          psVar13 = local_288;
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_280);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,
                              psVar6->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\" target\'s interface file set \"",0x1f);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(pcVar4->Name)._M_dataplus._M_p,(pcVar4->Name)._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" of type \"",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(pcVar4->Type)._M_dataplus._M_p,(pcVar4->Type)._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "\" contains context-sensitive base directory entries which is not supported.",
                     0x4b);
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,
                            CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                     local_2b8.field_2._M_local_buf[0]) + 1);
          }
          (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
          psVar13->_M_string_length = 0;
          (psVar13->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_228);
          goto LAB_00451b2e;
        }
      }
      else {
        if (lVar11 == 2) {
LAB_00451826:
          puVar9 = puVar8;
          if (((puVar8->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar8 = puVar8 + 1;
            goto LAB_00451836;
          }
          goto LAB_00451859;
        }
        if (lVar11 == 3) {
          puVar9 = puVar8;
          if (((puVar8->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar8 = puVar8 + 1;
            goto LAB_00451826;
          }
          goto LAB_00451859;
        }
LAB_0045189f:
        bVar3 = false;
      }
      for (; pbVar10 != pbVar5; pbVar10 = pbVar10 + 1) {
        str._M_str = (char *)0x1;
        str._M_len = (size_t)(pbVar10->_M_dataplus)._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_2d8,(cmOutputConverter *)pbVar10->_M_string_length,str,(WrapQuotes)psVar13
                  );
        if ((!bVar3) ||
           ((long)local_258.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_258.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20)) {
          local_1d8 = 1;
          local_1d0 = local_1c8;
          local_1c8[0] = '\"';
          local_1a8._0_8_ = (_func_int **)0x1;
          local_198 = local_2d8._M_string_length;
          local_190 = local_2d8._M_dataplus._M_p;
          local_2b8._M_dataplus._M_p = (pointer)0x1;
          local_2b8._M_string_length = (size_type)&local_2b8.field_2;
          local_2b8.field_2._M_local_buf[0] = '\"';
          local_188 = 1;
          views_00._M_len = 3;
          views_00._M_array = (iterator)local_1a8;
          local_1a8._8_8_ = local_1d0;
          local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2b8._M_string_length;
          cmCatViews_abi_cxx11_(&local_1f8,views_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278
                     ,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        local_190 = (config->_M_dataplus)._M_p;
        local_198 = config->_M_string_length;
        local_1a8._0_8_ = (_func_int **)0xc;
        local_1a8._8_8_ = "\"$<$<CONFIG:";
        local_188 = 2;
        local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x757fe1;
        local_178 = local_2d8._M_string_length;
        local_170 = local_2d8._M_dataplus._M_p;
        local_168 = 2;
        local_160 = ">\"";
        views._M_len = 5;
        views._M_array = (iterator)local_1a8;
        cmCatViews_abi_cxx11_(&local_2b8,views);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
                   &local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,
                          CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                   local_2b8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_228);
      config = config + 1;
    } while (config != local_230);
  }
  psVar13 = local_288;
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(local_288,&local_278,separator,(string_view)ZEXT816(0));
LAB_00451b2e:
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  return psVar13;
}

Assistant:

std::string cmExportBuildFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* /*te*/)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    bool const contextSensitive =
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->LG->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base directory entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& directory : directories) {
      auto dest = cmOutputConverter::EscapeForCMake(
        directory, cmOutputConverter::WrapQuotes::NoWrap);

      if (contextSensitive && configs.size() != 1) {
        resultVector.push_back(
          cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
      } else {
        resultVector.push_back(cmStrCat('"', dest, '"'));
        break;
      }
    }
  }

  return cmJoin(resultVector, " ");
}